

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelmapped.h
# Opt level: O1

void __thiscall
TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoQuad>_>::TPZGeoElMapped
          (TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoQuad>_> *this,TPZVec<long> *nodeindices,
          int matind,TPZGeoMesh *mesh)

{
  double *pdVar1;
  
  *(undefined ***)
   &(this->super_TPZGeoElRefPattern<pzgeom::TPZGeoQuad>).super_TPZGeoElRefLess<pzgeom::TPZGeoQuad>.
    super_TPZGeoEl = &PTR__TPZSavable_0192eeb8;
  TPZGeoElRefPattern<pzgeom::TPZGeoQuad>::TPZGeoElRefPattern
            (&this->super_TPZGeoElRefPattern<pzgeom::TPZGeoQuad>,&PTR_PTR_0192e440,nodeindices,
             matind,mesh);
  *(undefined ***)
   &(this->super_TPZGeoElRefPattern<pzgeom::TPZGeoQuad>).super_TPZGeoElRefLess<pzgeom::TPZGeoQuad>.
    super_TPZGeoEl = &PTR__TPZGeoElMapped_0192e130;
  pdVar1 = (this->fCornerCo).fBuf;
  (this->fCornerCo).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  (this->fCornerCo).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  (this->fCornerCo).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
  (this->fCornerCo).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 4;
  (this->fCornerCo).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed
       = '\0';
  (this->fCornerCo).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
  fDefPositive = '\0';
  (this->fCornerCo).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_018a12b0;
  (this->fCornerCo).super_TPZFMatrix<double>.fElem = pdVar1;
  (this->fCornerCo).super_TPZFMatrix<double>.fGiven = pdVar1;
  (this->fCornerCo).super_TPZFMatrix<double>.fSize = 8;
  TPZVec<int>::TPZVec(&(this->fCornerCo).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>,0);
  (this->fCornerCo).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0183cde8;
  (this->fCornerCo).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fStore =
       (this->fCornerCo).super_TPZFMatrix<double>.fPivot.fExtAlloc;
  (this->fCornerCo).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fNElements = 0;
  (this->fCornerCo).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fNAlloc = 0;
  (this->fCornerCo).super_TPZFMatrix<double>.fWork._vptr_TPZVec =
       (_func_int **)&PTR__TPZVec_0183b4b0;
  (this->fCornerCo).super_TPZFMatrix<double>.fWork.fStore = (double *)0x0;
  (this->fCornerCo).super_TPZFMatrix<double>.fWork.fNElements = 0;
  (this->fCornerCo).super_TPZFMatrix<double>.fWork.fNAlloc = 0;
  (this->fCornerCo).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_018a0fc0;
  TPZFMatrix<double>::operator=(&(this->fCornerCo).super_TPZFMatrix<double>,0.0);
  return;
}

Assistant:

TPZGeoElMapped(TPZVec<int64_t> &nodeindices,int matind,TPZGeoMesh &mesh) :
	TPZRegisterClassId(&TPZGeoElMapped::ClassId),
    TBase(nodeindices,matind,mesh), fCornerCo(Geo::Dimension,Geo::NNodes,0.)
	{
	}